

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

uchar * stbi__convert_format(uchar *data,int img_n,int req_comp,uint x,uint y)

{
  int iVar1;
  byte bVar2;
  uchar uVar3;
  uchar *puVar4;
  undefined8 *puVar5;
  long lVar6;
  ulong uVar7;
  byte *pbVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  int iVar12;
  uchar *puVar13;
  
  puVar4 = data;
  if (req_comp != img_n) {
    if (3 < req_comp - 1U) {
      __assert_fail("req_comp >= 1 && req_comp <= 4",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/flowkey[P]sdl-gpu/src/externals/stb_image/stb_image.h"
                    ,0x6e1,
                    "unsigned char *stbi__convert_format(unsigned char *, int, int, unsigned int, unsigned int)"
                   );
    }
    puVar4 = (uchar *)stbi__malloc_mad3(req_comp,x,y,0);
    if (puVar4 == (uchar *)0x0) {
      free(data);
      puVar5 = (undefined8 *)__tls_get_addr(&PTR_001f3f18);
      *puVar5 = "Out of memory";
      puVar4 = (uchar *)0x0;
    }
    else {
      if (0 < (int)y) {
        uVar11 = req_comp + img_n * 8;
        if ((0x23 < uVar11) || ((0xe161a1c00U >> ((ulong)uVar11 & 0x3f) & 1) == 0)) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/flowkey[P]sdl-gpu/src/externals/stb_image/stb_image.h"
                        ,0x6fe,
                        "unsigned char *stbi__convert_format(unsigned char *, int, int, unsigned int, unsigned int)"
                       );
        }
        iVar1 = x - 1;
        uVar10 = 0;
        uVar9 = 0;
        uVar7 = 0;
        do {
          iVar12 = (int)uVar7 * x;
          if (uVar11 - 10 < 0x19) {
            pbVar8 = data + (uint)(iVar12 * img_n);
            switch(uVar11) {
            case 10:
              if (-1 < iVar1) {
                lVar6 = 0;
                do {
                  puVar4[lVar6 * 2 + uVar9] = data[lVar6 + uVar10];
                  puVar4[lVar6 * 2 + uVar9 + 1] = 0xff;
                  lVar6 = lVar6 + 1;
                } while (x != (uint)lVar6);
              }
              break;
            case 0xb:
              if (-1 < iVar1) {
                puVar13 = puVar4 + uVar9 + 2;
                lVar6 = 0;
                do {
                  uVar3 = data[lVar6 + uVar10];
                  *puVar13 = uVar3;
                  puVar13[-1] = uVar3;
                  puVar13[-2] = uVar3;
                  lVar6 = lVar6 + 1;
                  puVar13 = puVar13 + 3;
                } while (x != (uint)lVar6);
              }
              break;
            case 0xc:
              if (-1 < iVar1) {
                lVar6 = 0;
                do {
                  uVar3 = data[lVar6 + uVar10];
                  puVar4[lVar6 * 4 + uVar9 + 2] = uVar3;
                  puVar4[lVar6 * 4 + uVar9 + 1] = uVar3;
                  puVar4[lVar6 * 4 + uVar9] = uVar3;
                  puVar4[lVar6 * 4 + uVar9 + 3] = 0xff;
                  lVar6 = lVar6 + 1;
                } while (x != (uint)lVar6);
              }
              break;
            default:
              goto switchD_001c4586_caseD_d;
            case 0x11:
              if (-1 < iVar1) {
                lVar6 = 0;
                do {
                  puVar4[lVar6 + uVar9] = data[lVar6 * 2 + uVar10];
                  lVar6 = lVar6 + 1;
                } while (x != (uint)lVar6);
              }
              break;
            case 0x13:
              if (-1 < iVar1) {
                puVar13 = puVar4 + uVar9 + 2;
                lVar6 = 0;
                do {
                  uVar3 = data[lVar6 * 2 + uVar10];
                  *puVar13 = uVar3;
                  puVar13[-1] = uVar3;
                  puVar13[-2] = uVar3;
                  lVar6 = lVar6 + 1;
                  puVar13 = puVar13 + 3;
                } while (x != (uint)lVar6);
              }
              break;
            case 0x14:
              if (-1 < iVar1) {
                lVar6 = 0;
                do {
                  uVar3 = data[lVar6 * 2 + uVar10];
                  puVar4[lVar6 * 4 + uVar9 + 2] = uVar3;
                  puVar4[lVar6 * 4 + uVar9 + 1] = uVar3;
                  puVar4[lVar6 * 4 + uVar9] = uVar3;
                  puVar4[lVar6 * 4 + uVar9 + 3] = data[lVar6 * 2 + uVar10 + 1];
                  lVar6 = lVar6 + 1;
                } while (x != (uint)lVar6);
              }
              break;
            case 0x19:
              if (-1 < iVar1) {
                lVar6 = 0;
                do {
                  bVar2 = pbVar8[2];
                  puVar4[lVar6 + uVar9] =
                       (uchar)((uint)bVar2 * 2 + ((uint)bVar2 + (uint)bVar2 * 8) * 3 +
                               (uint)pbVar8[1] * 0x96 + (uint)*pbVar8 * 0x4d >> 8);
                  lVar6 = lVar6 + 1;
                  pbVar8 = pbVar8 + 3;
                } while (x != (uint)lVar6);
              }
              break;
            case 0x1a:
              if (-1 < iVar1) {
                lVar6 = 0;
                do {
                  bVar2 = pbVar8[2];
                  puVar4[lVar6 * 2 + uVar9] =
                       (uchar)((uint)bVar2 * 2 + ((uint)bVar2 + (uint)bVar2 * 8) * 3 +
                               (uint)pbVar8[1] * 0x96 + (uint)*pbVar8 * 0x4d >> 8);
                  puVar4[lVar6 * 2 + uVar9 + 1] = 0xff;
                  lVar6 = lVar6 + 1;
                  pbVar8 = pbVar8 + 3;
                } while (x != (uint)lVar6);
              }
              break;
            case 0x1c:
              if (-1 < iVar1) {
                lVar6 = 0;
                do {
                  puVar4[lVar6 * 4 + uVar9] = *pbVar8;
                  puVar4[lVar6 * 4 + uVar9 + 1] = pbVar8[1];
                  puVar4[lVar6 * 4 + uVar9 + 2] = pbVar8[2];
                  puVar4[lVar6 * 4 + uVar9 + 3] = 0xff;
                  lVar6 = lVar6 + 1;
                  pbVar8 = pbVar8 + 3;
                } while (x != (uint)lVar6);
              }
              break;
            case 0x21:
              if (-1 < iVar1) {
                lVar6 = 0;
                do {
                  bVar2 = data[lVar6 * 4 + uVar10 + 2];
                  puVar4[lVar6 + uVar9] =
                       (uchar)((uint)bVar2 * 2 + ((uint)bVar2 + (uint)bVar2 * 8) * 3 +
                               (uint)data[lVar6 * 4 + uVar10 + 1] * 0x96 +
                               (uint)data[lVar6 * 4 + uVar10] * 0x4d >> 8);
                  lVar6 = lVar6 + 1;
                } while (x != (uint)lVar6);
              }
              break;
            case 0x22:
              if (-1 < iVar1) {
                lVar6 = 0;
                do {
                  bVar2 = data[lVar6 * 4 + uVar10 + 2];
                  puVar4[lVar6 * 2 + uVar9] =
                       (uchar)((uint)bVar2 * 2 + ((uint)bVar2 + (uint)bVar2 * 8) * 3 +
                               (uint)data[lVar6 * 4 + uVar10 + 1] * 0x96 +
                               (uint)data[lVar6 * 4 + uVar10] * 0x4d >> 8);
                  puVar4[lVar6 * 2 + uVar9 + 1] = data[lVar6 * 4 + uVar10 + 3];
                  lVar6 = lVar6 + 1;
                } while (x != (uint)lVar6);
              }
            }
          }
          else {
switchD_001c4586_caseD_d:
            if (-1 < iVar1) {
              puVar13 = puVar4 + (uint)(iVar12 * req_comp);
              lVar6 = 0;
              do {
                *puVar13 = data[lVar6 * 4 + uVar10];
                puVar13[1] = data[lVar6 * 4 + uVar10 + 1];
                puVar13[2] = data[lVar6 * 4 + uVar10 + 2];
                lVar6 = lVar6 + 1;
                puVar13 = puVar13 + 3;
              } while (x != (uint)lVar6);
            }
          }
          uVar7 = uVar7 + 1;
          uVar9 = (ulong)((int)uVar9 + x * req_comp);
          uVar10 = (ulong)((int)uVar10 + x * img_n);
        } while (uVar7 != y);
      }
      free(data);
    }
  }
  return puVar4;
}

Assistant:

static unsigned char *stbi__convert_format(unsigned char *data, int img_n, int req_comp, unsigned int x, unsigned int y)
{
   int i,j;
   unsigned char *good;

   if (req_comp == img_n) return data;
   STBI_ASSERT(req_comp >= 1 && req_comp <= 4);

   good = (unsigned char *) stbi__malloc_mad3(req_comp, x, y, 0);
   if (good == NULL) {
      STBI_FREE(data);
      return stbi__errpuc("outofmem", "Out of memory");
   }

   for (j=0; j < (int) y; ++j) {
      unsigned char *src  = data + j * x * img_n   ;
      unsigned char *dest = good + j * x * req_comp;

      #define STBI__COMBO(a,b)  ((a)*8+(b))
      #define STBI__CASE(a,b)   case STBI__COMBO(a,b): for(i=x-1; i >= 0; --i, src += a, dest += b)
      // convert source image with img_n components to one with req_comp components;
      // avoid switch per pixel, so use switch per scanline and massive macros
      switch (STBI__COMBO(img_n, req_comp)) {
         STBI__CASE(1,2) { dest[0]=src[0]; dest[1]=255;                                     } break;
         STBI__CASE(1,3) { dest[0]=dest[1]=dest[2]=src[0];                                  } break;
         STBI__CASE(1,4) { dest[0]=dest[1]=dest[2]=src[0]; dest[3]=255;                     } break;
         STBI__CASE(2,1) { dest[0]=src[0];                                                  } break;
         STBI__CASE(2,3) { dest[0]=dest[1]=dest[2]=src[0];                                  } break;
         STBI__CASE(2,4) { dest[0]=dest[1]=dest[2]=src[0]; dest[3]=src[1];                  } break;
         STBI__CASE(3,4) { dest[0]=src[0];dest[1]=src[1];dest[2]=src[2];dest[3]=255;        } break;
         STBI__CASE(3,1) { dest[0]=stbi__compute_y(src[0],src[1],src[2]);                   } break;
         STBI__CASE(3,2) { dest[0]=stbi__compute_y(src[0],src[1],src[2]); dest[1] = 255;    } break;
         STBI__CASE(4,1) { dest[0]=stbi__compute_y(src[0],src[1],src[2]);                   } break;
         STBI__CASE(4,2) { dest[0]=stbi__compute_y(src[0],src[1],src[2]); dest[1] = src[3]; } break;
         STBI__CASE(4,3) { dest[0]=src[0];dest[1]=src[1];dest[2]=src[2];                    } break;
         default: STBI_ASSERT(0); STBI_FREE(data); STBI_FREE(good); return stbi__errpuc("unsupported", "Unsupported format conversion");
      }
      #undef STBI__CASE
   }

   STBI_FREE(data);
   return good;
}